

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
           *this,float *args,float *args_1,float *args_2)

{
  int iVar1;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *in_RSI;
  PyObject *in_RDI;
  simple_collector<(pybind11::return_value_policy)1> *in_R8;
  float *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  handle reason;
  PyObject *in_stack_ffffffffffffffd0;
  
  reason.m_ptr = in_RDI;
  iVar1 = PyGILState_Check();
  if (iVar1 == 0) {
    pybind11_fail((char *)reason.m_ptr);
  }
  collect_arguments<(pybind11::return_value_policy)1,float_const&,float_const&,float_const&,void>
            ((float *)in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::derived
            (in_RSI);
  accessor<pybind11::detail::accessor_policies::str_attr>::ptr
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x1a9c85);
  simple_collector<(pybind11::return_value_policy)1>::call(in_R8,in_stack_ffffffffffffffd0);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x1a9cac);
  return (object)(handle)reason.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#if !defined(NDEBUG) && PY_VERSION_HEX >= 0x03060000
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}